

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

bool __thiscall CMU462::DynamicScene::Scene::addObject(Scene *this,SceneObject *o)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  iterator i;
  SceneObject *o_local;
  Scene *this_local;
  
  i._M_node = (_Base_ptr)o;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::find(&this->objects,(key_type *)&i);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(&this->objects);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    (i._M_node)->_M_parent = (_Base_ptr)this;
    (*(code *)**(undefined8 **)i._M_node)
              (i._M_node,this->defaultStyle,this->hoveredStyle,this->selectedStyle);
    std::
    set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
    ::insert(&this->objects,(value_type *)&i);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Scene::addObject( SceneObject* o )
{
   auto i = objects.find( o );
   if( i != objects.end() )
   {
      return false;
   }

   o->scene = this;
   o->set_draw_styles(defaultStyle, hoveredStyle, selectedStyle);
   objects.insert( o );
   return true;
}